

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSimdLaneOp(TypeChecker *this,Opcode opcode,uint64_t lane_idx)

{
  Enum EVar1;
  Result RVar2;
  Result local_28;
  uint32_t local_24;
  uint64_t uStack_20;
  uint32_t lane_count;
  uint64_t lane_idx_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  uStack_20 = lane_idx;
  lane_idx_local = (uint64_t)this;
  this_local._0_4_ = opcode.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  local_24 = Opcode::GetSimdLaneCount((Opcode *)&this_local);
  if (local_24 <= uStack_20) {
    PrintError(this,"lane index must be less than %d (got %lu)",(ulong)local_24,uStack_20);
    Result::Result(&local_28,Error);
    this_local._4_4_ = local_28.enum_;
  }
  EVar1 = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
  if (EVar1 - I8X16ExtractLaneS < 2) {
LAB_002a790a:
    RVar2 = CheckOpcode1(this,this_local._0_4_,(Limits *)0x0,false);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  else {
    if (EVar1 != I8X16ReplaceLane) {
      if (EVar1 - I16X8ExtractLaneS < 2) goto LAB_002a790a;
      if (EVar1 != I16X8ReplaceLane) {
        if (EVar1 == I32X4ExtractLane) goto LAB_002a790a;
        if (EVar1 != I32X4ReplaceLane) {
          if (EVar1 == I64X2ExtractLane) goto LAB_002a790a;
          if (EVar1 != I64X2ReplaceLane) {
            if (EVar1 == F32X4ExtractLane) goto LAB_002a790a;
            if (EVar1 != F32X4ReplaceLane) {
              if (EVar1 == F64X2ExtractLane) goto LAB_002a790a;
              if (EVar1 != F64X2ReplaceLane) {
                abort();
              }
            }
          }
        }
      }
    }
    RVar2 = CheckOpcode2(this,this_local._0_4_,(Limits *)0x0);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSimdLaneOp(Opcode opcode, uint64_t lane_idx) {
  Result result = Result::Ok;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
    result = Result::Error;
  }

  switch (opcode) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F64X2ExtractLane:
      result |= CheckOpcode1(opcode);
      break;
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      result |= CheckOpcode2(opcode);
      break;
    default:
      WABT_UNREACHABLE;
  }
  return result;
}